

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float64_log2_s390x(float64 a,float_status *status)

{
  bool bVar1;
  long lVar2;
  float64 fVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t zSig;
  uint uVar6;
  flag zSign;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  uVar7 = a & 0xfffffffffffff;
  uVar6 = (uint)(a >> 0x34) & 0x7ff;
  if (uVar6 == 0) {
    if (uVar7 == 0) {
      return 0xfff0000000000000;
    }
    lVar2 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar6 = ((uint)lVar2 ^ 0x3f) + 0xf5;
    uVar7 = uVar7 << ((byte)uVar6 & 0x3f);
    uVar6 = 1 - (uVar6 & 0xff);
  }
  if ((long)a < 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
    a = 0x7ff8000000000000;
  }
  else {
    if (uVar6 != 0x7ff) {
      uVar7 = uVar7 | 0x10000000000000;
      uVar5 = (ulong)(uVar6 + 0xc01) << 0x34;
      uVar8 = 0x8000000000000;
      do {
        uVar4 = uVar7 >> 0x20;
        uVar9 = (uVar7 & 0xffffffff) * uVar4;
        uVar10 = uVar9 >> 0x1f;
        uVar4 = ((uVar10 & 0xffffffff) + uVar4 * uVar4 + (uVar10 & 0x100000000) +
                (ulong)(uVar7 * uVar7 < uVar9 << 0x21)) * 0x1000;
        uVar9 = uVar4 | uVar7 * uVar7 >> 0x34;
        uVar7 = uVar9 >> ((byte)(uVar4 >> 0x35) & 1);
        uVar5 = uVar5 | (long)(uVar9 << 10) >> 0x3f & uVar8;
        bVar1 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar1);
      if ((int)uVar6 < 0x3ff) {
        uVar5 = -uVar5;
        if (uVar5 == 0) {
          uVar6 = 0x40;
        }
        else {
          lVar2 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar6 = (uint)lVar2 ^ 0x3f;
        }
        zSig = uVar5 << ((char)uVar6 - 1U & 0x3f);
        zSign = '\x01';
      }
      else {
        if (uVar5 == 0) {
          uVar6 = 0x40;
        }
        else {
          lVar2 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar6 = (uint)lVar2 ^ 0x3f;
        }
        zSig = uVar5 << ((char)uVar6 - 1U & 0x3f);
        zSign = '\0';
      }
      fVar3 = roundAndPackFloat64(zSign,0x409 - uVar6,zSig,status);
      return fVar3;
    }
    if (uVar7 != 0) {
      fVar3 = propagateFloat64NaN(a,0,status);
      return fVar3;
    }
  }
  return a;
}

Assistant:

float64 float64_log2(float64 a, float_status *status)
{
    flag aSign, zSign;
    int aExp;
    uint64_t aSig, aSig0, aSig1, zSig, i;
    a = float64_squash_input_denormal(a, status);

    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );

    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat64( 1, 0x7FF, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    if ( aSign ) {
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return propagateFloat64NaN(a, float64_zero, status);
        }
        return a;
    }

    aExp -= 0x3FF;
    aSig |= UINT64_C(0x0010000000000000);
    zSign = aExp < 0;
    zSig = (uint64_t)aExp << 52;
    for (i = 1LL << 51; i > 0; i >>= 1) {
        mul64To128( aSig, aSig, &aSig0, &aSig1 );
        aSig = ( aSig0 << 12 ) | ( aSig1 >> 52 );
        if ( aSig & UINT64_C(0x0020000000000000) ) {
            aSig >>= 1;
            zSig |= i;
        }
    }

    if ( zSign )
#ifdef _MSC_VER
        zSig = 0 - zSig;
#else
        zSig = -zSig;
#endif
    return normalizeRoundAndPackFloat64(zSign, 0x408, zSig, status);
}